

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeCallIndirect(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  Module *pMVar1;
  char *pcVar2;
  Type type_00;
  byte bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Expression *pEVar6;
  long lVar7;
  Const *target;
  Type *pTVar8;
  uintptr_t *puVar9;
  CallIndirect *pCVar10;
  long extraout_RDX;
  long extraout_RDX_00;
  uintptr_t extraout_RDX_01;
  uint uVar11;
  Name NVar12;
  Name NVar13;
  Literal local_a0;
  Type local_88;
  Expression *local_80;
  TranslateToFuzzReader *local_78;
  Random *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Iterator __begin1;
  uint32_t local_34;
  
  pMVar1 = this->wasm;
  this_00 = &this->random;
  uVar4 = Random::upTo(this_00,(uint32_t)
                               ((ulong)(*(long *)(pMVar1 + 0x68) - *(long *)(pMVar1 + 0x60)) >> 3));
  lVar7 = *(long *)(*(long *)(pMVar1 + 0x60) + (ulong)uVar4 * 8);
  if (*(long *)(lVar7 + 0x38) == *(long *)(lVar7 + 0x40)) {
    pEVar6 = make(this,type);
    return pEVar6;
  }
  local_70 = this_00;
  uVar5 = Random::upTo(this_00,(uint32_t)
                               ((ulong)(*(long *)(lVar7 + 0x40) - *(long *)(lVar7 + 0x38)) >> 3));
  uVar4 = uVar5;
  local_78 = this;
  local_34 = uVar5;
  while( true ) {
    pcVar2 = *(char **)(*(long *)(lVar7 + 0x38) + (ulong)uVar4 * 8);
    bVar3 = 1;
    if (*pcVar2 == '+') {
      NVar12.super_IString.str._M_str = *(char **)(pcVar2 + 0x10);
      NVar12.super_IString.str._M_len = (size_t)this->wasm;
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           wasm::Module::getFunction(NVar12);
      if ((type.id == 1) && (((byte)this->wasm[0x178] & 0x80) != 0)) {
        wasm::HeapType::getSignature();
        wasm::HeapType::getSignature();
        local_34 = (uint32_t)(extraout_RDX == extraout_RDX_00);
      }
      else {
        local_34 = 0;
      }
      wasm::HeapType::getSignature();
      bVar3 = extraout_RDX_01 != type.id & ~(byte)local_34;
      this = local_78;
    }
    if (bVar3 == 0) break;
    uVar11 = uVar4 + 1;
    uVar4 = 0;
    if (*(long *)(lVar7 + 0x40) - *(long *)(lVar7 + 0x38) >> 3 != (ulong)uVar11) {
      uVar4 = uVar11;
    }
    if (uVar4 == uVar5) {
      pEVar6 = makeTrivial(this,type);
      return pEVar6;
    }
  }
  NVar13.super_IString.str._M_str = (char *)(this->funcrefTableName).super_IString.str._M_len;
  NVar13.super_IString.str._M_len = (size_t)this->wasm;
  lVar7 = wasm::Module::getTable(NVar13);
  type_00.id = *(uintptr_t *)(lVar7 + 0x48);
  if ((this->allowOOB == true) && (uVar5 = Random::upTo(local_70,10), uVar5 == 0)) {
    target = (Const *)make(this,type_00);
  }
  else {
    Literal::makeFromInt32(&local_a0,uVar4,type_00);
    target = Builder::makeConst(&this->builder,&local_a0);
    wasm::Literal::~Literal(&local_a0);
  }
  auStack_68 = (undefined1  [8])0x0;
  args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.id = wasm::HeapType::getSignature();
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_88;
  pTVar8 = (Type *)Type::size(&local_88);
  if (pTVar8 == (Type *)0x0) goto LAB_0012ed39;
  do {
    do {
      puVar9 = (uintptr_t *)
               wasm::Type::Iterator::operator*
                         ((Iterator *)
                          &args.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_80 = make(this,(Type)*puVar9);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,&local_80
                );
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
    } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
             pTVar8);
LAB_0012ed39:
  } while ((Type *)args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage != &local_88);
  pCVar10 = Builder::
            makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                      (&this->builder,(Name)(this->funcrefTableName).super_IString.str,
                       (Expression *)target,
                       (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_68
                       ,(HeapType)
                        *(uintptr_t *)
                         (__begin1.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                         + 0x38),(bool)((byte)local_34 & 1));
  if (auStack_68 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_68,
                    (long)args.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
  }
  return (Expression *)pCVar10;
}

Assistant:

Expression* TranslateToFuzzReader::makeCallIndirect(Type type) {
  auto& randomElem = wasm.elementSegments[upTo(wasm.elementSegments.size())];
  auto& data = randomElem->data;
  if (data.empty()) {
    return make(type);
  }
  // look for a call target with the right type
  Index start = upTo(data.size());
  Index i = start;
  Function* targetFn;
  bool isReturn;
  while (1) {
    // TODO: handle unreachable
    if (auto* get = data[i]->dynCast<RefFunc>()) {
      targetFn = wasm.getFunction(get->func);
      isReturn = type == Type::unreachable && wasm.features.hasTailCall() &&
                 funcContext->func->getResults() == targetFn->getResults();
      if (targetFn->getResults() == type || isReturn) {
        break;
      }
    }
    i++;
    if (i == data.size()) {
      i = 0;
    }
    if (i == start) {
      return makeTrivial(type);
    }
  }
  // with high probability, make sure the type is valid - otherwise, most are
  // going to trap
  auto addressType = wasm.getTable(funcrefTableName)->addressType;
  Expression* target;
  if (!allowOOB || !oneIn(10)) {
    target = builder.makeConst(Literal::makeFromInt32(i, addressType));
  } else {
    target = make(addressType);
  }
  std::vector<Expression*> args;
  for (const auto& type : targetFn->getParams()) {
    args.push_back(make(type));
  }
  // TODO: use a random table
  return builder.makeCallIndirect(
    funcrefTableName, target, args, targetFn->type, isReturn);
}